

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O3

int SensorBase::detect_sensor(string *type)

{
  size_type sVar1;
  ulong uVar2;
  _Alloc_hider _Var3;
  long *plVar4;
  int iVar5;
  uint uVar6;
  path *ppVar7;
  long lVar8;
  long *__nptr;
  bool bVar9;
  directory_iterator __begin1;
  path name_path;
  string es;
  path sysfsbasepath;
  directory_iterator local_110;
  string *local_100;
  directory_iterator local_f8;
  path local_e8;
  string local_c0;
  path local_a0;
  long *local_78;
  long local_70;
  long local_68 [2];
  path local_58;
  
  local_100 = type;
  std::filesystem::__cxx11::path::path<char[32],std::filesystem::__cxx11::path>
            (&local_a0,(char (*) [32])"/sys/bus/iio/devices/iio:device",auto_format);
  ppVar7 = (path *)std::filesystem::__cxx11::path::remove_filename();
  std::filesystem::__cxx11::path::path(&local_58,ppVar7);
  std::filesystem::__cxx11::path::~path(&local_a0);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_f8,&local_58,none,(error_code *)0x0);
  if (local_f8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_110._M_dir._M_ptr = local_f8._M_dir._M_ptr;
    local_110._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
      local_110._M_dir._M_ptr = local_f8._M_dir._M_ptr;
      local_110._M_dir._M_refcount._M_pi = local_f8._M_dir._M_refcount._M_pi;
      if (local_f8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_0010d5b7;
    }
    else {
      *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) + 1;
    }
    local_110._M_dir._M_ptr = local_f8._M_dir._M_ptr;
    local_110._M_dir._M_refcount._M_pi = local_f8._M_dir._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_f8._M_dir._M_refcount._M_pi + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_dir._M_refcount._M_pi)
    ;
  }
LAB_0010d5b7:
  while (local_110._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
  {
    ppVar7 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_110);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_e8,(char (*) [5])"name",auto_format);
    std::filesystem::__cxx11::operator/(&local_a0,ppVar7,&local_e8);
    std::filesystem::__cxx11::path::~path(&local_e8);
    readstr_abi_cxx11_(&local_c0,local_a0._M_pathname._M_dataplus._M_p,0x100);
    trim(&local_e8._M_pathname,&local_c0);
    _Var3._M_p = local_e8._M_pathname._M_dataplus._M_p;
    if (local_e8._M_pathname._M_string_length == local_100->_M_string_length) {
      if (local_e8._M_pathname._M_string_length == 0) {
        bVar9 = true;
      }
      else {
        iVar5 = bcmp(local_e8._M_pathname._M_dataplus._M_p,(local_100->_M_dataplus)._M_p,
                     local_e8._M_pathname._M_string_length);
        bVar9 = iVar5 == 0;
      }
    }
    else {
      bVar9 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_e8._M_pathname.field_2) {
      operator_delete(_Var3._M_p,local_e8._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (bVar9) {
      sVar1 = (ppVar7->_M_pathname)._M_string_length;
      if (sVar1 == 0) {
LAB_0010d72b:
        std::filesystem::__cxx11::path::path(&local_e8);
      }
      else {
        uVar2 = *(ulong *)&ppVar7->_M_cmpts;
        uVar6 = (uint)uVar2;
        if ((~(byte)uVar2 & 3) != 0) {
          if (((uVar2 & 3) == 0) && ((ppVar7->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
            if ((uVar2 & 3) == 0) {
              lVar8 = std::filesystem::__cxx11::path::_List::end();
              if ((*(ulong *)&ppVar7->_M_cmpts & 3) == 0) {
                ppVar7 = (path *)(lVar8 + -0x30);
              }
              uVar6 = (uint)*(undefined8 *)&ppVar7->_M_cmpts;
            }
            if ((~uVar6 & 3) == 0) goto LAB_0010d71c;
          }
          goto LAB_0010d72b;
        }
LAB_0010d71c:
        std::filesystem::__cxx11::path::path(&local_e8,ppVar7);
      }
      local_78 = local_68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,local_e8._M_pathname._M_dataplus._M_p,
                 local_e8._M_pathname._M_dataplus._M_p + local_e8._M_pathname._M_string_length);
      std::filesystem::__cxx11::path::~path(&local_e8);
      plVar4 = local_78;
      iVar5 = -1;
      __nptr = local_78;
      if (local_70 != 0) goto LAB_0010d779;
      goto LAB_0010d794;
    }
    std::filesystem::__cxx11::path::~path(&local_a0);
    std::filesystem::__cxx11::directory_iterator::operator++(&local_110);
  }
  iVar5 = -1;
LAB_0010d7c5:
  if (local_f8._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_dir._M_refcount._M_pi)
    ;
  }
  std::filesystem::__cxx11::path::~path(&local_58);
  return iVar5;
  while( true ) {
    local_70 = local_70 + -1;
    __nptr = (long *)((long)__nptr + 1);
    if (local_70 == 0) break;
LAB_0010d779:
    if (0xf5 < (byte)((char)*__nptr - 0x3aU)) {
      iVar5 = atoi((char *)__nptr);
      break;
    }
  }
LAB_0010d794:
  if (plVar4 != local_68) {
    operator_delete(plVar4,local_68[0] + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_a0);
  if (local_110._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110._M_dir._M_refcount._M_pi);
  }
  goto LAB_0010d7c5;
}

Assistant:

int SensorBase::detect_sensor(std::string type)
{
	using filesystem::path;
	path sysfsbasepath=path(IIODEV_SYSFS_PATH_BASE).remove_filename();
	for(auto& ent:filesystem::directory_iterator(sysfsbasepath))
	{
		path name_path=ent.path()/"name";
		if(trim(readstr(name_path.c_str()))==type)
		{
			std::string es=ent.path().filename().string();
			size_t i;
			for(i=0;i<es.length()&&(es[i]<'0'||es[i]>'9');++i);
			if(i<es.length())return atoi(es.c_str()+i);
			return -1;
		}
	}
	return -1;
}